

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void pre_text_out(c2m_ctx_t c2m_ctx,token_t t)

{
  short sVar1;
  pre_ctx *ppVar2;
  FILE *__stream;
  char *pcVar3;
  int iVar4;
  int iVar5;
  
  ppVar2 = c2m_ctx->pre_ctx;
  __stream = (FILE *)c2m_ctx->options->prepro_output_file;
  if (((t == (token_t)0x0) && (ppVar2->pre_last_token != (token_t)0x0)) &&
     (*(short *)ppVar2->pre_last_token == 10)) {
    fputc(10,__stream);
    return;
  }
  sVar1 = *(short *)t;
  if (sVar1 == 10) goto LAB_0015fea3;
  if ((ppVar2->actual_pre_pos).fname == (t->pos).fname) {
    iVar5 = (ppVar2->actual_pre_pos).lno;
    iVar4 = (t->pos).lno;
    if (iVar5 != iVar4) {
      if (iVar5 + 4 < iVar4 || iVar4 <= iVar5) goto LAB_0015fda5;
      while (iVar5 != iVar4) {
        fputc(10,__stream);
        iVar5 = (ppVar2->actual_pre_pos).lno + 1;
        (ppVar2->actual_pre_pos).lno = iVar5;
        iVar4 = (t->pos).lno;
      }
      goto LAB_0015fe22;
    }
  }
  else {
LAB_0015fda5:
    if (ppVar2->pre_last_token != (token_t)0x0) {
      fputc(10,__stream);
    }
    fprintf(__stream,"#line %d",(ulong)(uint)(t->pos).lno);
    pcVar3 = (t->pos).fname;
    if ((ppVar2->actual_pre_pos).fname != pcVar3) {
      stringify(pcVar3,c2m_ctx->temp_string);
      VARR_charpush(c2m_ctx->temp_string,'\0');
      pcVar3 = VARR_charaddr(c2m_ctx->temp_string);
      fprintf(__stream," %s",pcVar3);
    }
    fputc(10,__stream);
LAB_0015fe22:
    for (iVar5 = 0; iVar5 < (t->pos).ln_pos + -1; iVar5 = iVar5 + 1) {
      fputc(0x20,__stream);
    }
    iVar5 = (t->pos).lno;
    iVar4 = (t->pos).ln_pos;
    (ppVar2->actual_pre_pos).fname = (t->pos).fname;
    (ppVar2->actual_pre_pos).lno = iVar5;
    (ppVar2->actual_pre_pos).ln_pos = iVar4;
    sVar1 = *(short *)t;
  }
  if (sVar1 == 0x20) {
    pcVar3 = " ";
  }
  else {
    pcVar3 = t->repr;
  }
  fputs(pcVar3,__stream);
LAB_0015fea3:
  ppVar2->pre_last_token = t;
  return;
}

Assistant:

static void pre_text_out (c2m_ctx_t c2m_ctx, token_t t) { /* NULL means end of output */
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  int i;
  FILE *f = c2m_options->prepro_output_file;

  if (t == NULL && pre_last_token != NULL && pre_last_token->code == '\n') {
    fprintf (f, "\n");
    return;
  }
  if (t->code == '\n') {
    pre_last_token = t;
    return;
  }
  if (actual_pre_pos.fname != t->pos.fname || actual_pre_pos.lno != t->pos.lno) {
    if (actual_pre_pos.fname == t->pos.fname && actual_pre_pos.lno < t->pos.lno
        && actual_pre_pos.lno + 4 >= t->pos.lno) {
      for (; actual_pre_pos.lno != t->pos.lno; actual_pre_pos.lno++) fprintf (f, "\n");
    } else {
      if (pre_last_token != NULL) fprintf (f, "\n");
      fprintf (f, "#line %d", t->pos.lno);
      if (actual_pre_pos.fname != t->pos.fname) {
        stringify (t->pos.fname, temp_string);
        VARR_PUSH (char, temp_string, '\0');
        fprintf (f, " %s", VARR_ADDR (char, temp_string));
      }
      fprintf (f, "\n");
    }
    for (i = 0; i < t->pos.ln_pos - 1; i++) fprintf (f, " ");
    actual_pre_pos = t->pos;
  }
  fprintf (f, "%s", t->code == ' ' ? " " : t->repr);
  pre_last_token = t;
}